

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O3

void png_write_cHRM_fixed(png_structrp png_ptr,png_xy *xy)

{
  png_byte buf [32];
  png_byte apStack_38 [4];
  png_byte local_34 [4];
  png_byte local_30 [4];
  png_byte local_2c [4];
  png_byte local_28 [4];
  png_byte local_24 [4];
  png_byte local_20 [4];
  png_byte local_1c [4];
  
  png_save_int_32(apStack_38,xy->whitex);
  png_save_int_32(local_34,xy->whitey);
  png_save_int_32(local_30,xy->redx);
  png_save_int_32(local_2c,xy->redy);
  png_save_int_32(local_28,xy->greenx);
  png_save_int_32(local_24,xy->greeny);
  png_save_int_32(local_20,xy->bluex);
  png_save_int_32(local_1c,xy->bluey);
  png_write_complete_chunk(png_ptr,0x6348524d,apStack_38,0x20);
  return;
}

Assistant:

void /* PRIVATE */
png_write_cHRM_fixed(png_structrp png_ptr, const png_xy *xy)
{
   png_byte buf[32];

   png_debug(1, "in png_write_cHRM");

   /* Each value is saved in 1/100,000ths */
   png_save_int_32(buf,      xy->whitex);
   png_save_int_32(buf +  4, xy->whitey);

   png_save_int_32(buf +  8, xy->redx);
   png_save_int_32(buf + 12, xy->redy);

   png_save_int_32(buf + 16, xy->greenx);
   png_save_int_32(buf + 20, xy->greeny);

   png_save_int_32(buf + 24, xy->bluex);
   png_save_int_32(buf + 28, xy->bluey);

   png_write_complete_chunk(png_ptr, png_cHRM, buf, 32);
}